

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O2

UINT8 device_start_ym2413_nuked(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA chipptr;
  uint uVar2;
  UINT8 UVar3;
  
  uVar1 = cfg->clock;
  uVar2 = uVar1 / 0x48;
  if (cfg->srMode == '\x02') {
    if (uVar2 <= cfg->smplRate) {
      uVar2 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar2 = cfg->smplRate;
  }
  chipptr.chipInf = calloc(1,0x8200);
  if ((DEV_DATA *)chipptr.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(uint *)&((DEV_DATA *)((long)chipptr.chipInf + 8))->chipInf = uVar1;
    *(uint *)((long)chipptr.chipInf + 0xc) = uVar2;
    *(uint *)&((DEV_DATA *)((long)chipptr.chipInf + 0x10))->chipInf = cfg->flags & 1;
    UVar3 = '\0';
    nukedopll_set_mute_mask(chipptr.chipInf,0);
    *(void **)chipptr.chipInf = chipptr.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chipptr.chipInf;
    retDevInf->sampleRate = uVar2;
    retDevInf->devDef = &devDef_YM2413_Nuked;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_ym2413_nuked(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	opll_t* chip;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = (opll_t*)calloc(1, sizeof(opll_t));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	chip->smplRate = rate; // save for reset
	chip->chip_type = (cfg->flags & 0x01) ? opll_type_ds1001 : opll_type_ym2413;
	nukedopll_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2413_Nuked);
	return 0x00;
}